

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_types.cpp
# Opt level: O0

void __thiscall SerializeSpan_Read_Test::SerializeSpan_Read_Test(SerializeSpan_Read_Test *this)

{
  SerializeSpan_Read_Test *this_local;
  
  anon_unknown.dwarf_54ed9::SerializeSpan::SerializeSpan(&this->super_SerializeSpan);
  (this->super_SerializeSpan).super_Test._vptr_Test =
       (_func_int **)&PTR__SerializeSpan_Read_Test_00233438;
  return;
}

Assistant:

TEST_F (SerializeSpan, Read) {
    using ::testing::_;

    SerializeSpan::mock_span_archive arch;
    EXPECT_CALL (arch, writen (_)).Times (0);
    EXPECT_CALL (arch, readn (_)).Times (1);

    std::array<simple_struct, 2> my;
    pstore::serialize::read (arch, ::pstore::gsl::span<simple_struct>{my});
}